

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetComponentName(xmlSchemaBasicItemPtr item)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaBasicItemPtr item_local;
  
  if (item == (xmlSchemaBasicItemPtr)0x0) {
    item_local = (xmlSchemaBasicItemPtr)0x0;
  }
  else {
    xVar1 = item->type;
    if ((xVar1 == XML_SCHEMA_TYPE_BASIC) || (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2)) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 1);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ELEMENT) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 1);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 1);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 1);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_GROUP) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 2);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_NOTATION) {
      item_local = (xmlSchemaBasicItemPtr)item->dummy;
    }
    else if (xVar1 - XML_SCHEMA_TYPE_IDC_UNIQUE < 3) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 2);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
      if (item[1].dummy == (void *)0x0) {
        item_local = (xmlSchemaBasicItemPtr)0x0;
      }
      else {
        item_local = (xmlSchemaBasicItemPtr)
                     xmlSchemaGetComponentName((xmlSchemaBasicItemPtr)item[1].dummy);
      }
    }
    else if (xVar1 == XML_SCHEMA_EXTRA_QNAMEREF) {
      item_local = (xmlSchemaBasicItemPtr)item[1].dummy;
    }
    else {
      item_local = (xmlSchemaBasicItemPtr)0x0;
    }
  }
  return (xmlChar *)item_local;
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentName(xmlSchemaBasicItemPtr item)
{
    if (item == NULL) {
        return (NULL);
    }
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->name);
	case XML_SCHEMA_TYPE_BASIC:
	case XML_SCHEMA_TYPE_SIMPLE:
	case XML_SCHEMA_TYPE_COMPLEX:
	    return (((xmlSchemaTypePtr) item)->name);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->name);
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    if (WXS_ATTRUSE_DECL(item) != NULL) {
		return(xmlSchemaGetComponentName(
		    WXS_BASIC_CAST WXS_ATTRUSE_DECL(item)));
	    } else
		return(NULL);
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return (((xmlSchemaQNameRefPtr) item)->name);
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->name);
	default:
	    /*
	    * Other components cannot have names.
	    */
	    break;
    }
    return (NULL);
}